

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall dlib::text_field::set_text_color(text_field *this,rgb_pixel color)

{
  undefined4 in_ESI;
  auto_mutex *in_RDI;
  auto_mutex M;
  undefined5 in_stack_00000040;
  rmutex *in_stack_ffffffffffffffb8;
  
  auto_mutex::auto_mutex(in_RDI,in_stack_ffffffffffffffb8);
  *(char *)((long)&in_RDI[6].rw + 2) = (char)((uint)in_ESI >> 0x10);
  *(short *)&in_RDI[6].rw = (short)in_ESI;
  base_window::invalidate_rectangle
            ((base_window *)CONCAT35(color,in_stack_00000040),(rectangle *)this);
  auto_mutex::~auto_mutex((auto_mutex *)0x4309e7);
  return;
}

Assistant:

void text_field::
    set_text_color (
        const rgb_pixel color
    )
    {
        auto_mutex M(m);
        text_color_ = color;
        parent.invalidate_rectangle(rect);
    }